

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O1

void __thiscall
icu_63::ChineseCalendar::offsetMonth
          (ChineseCalendar *this,int32_t newMoon,int32_t dom,int32_t delta)

{
  uint in_EAX;
  int iVar1;
  int iVar2;
  UErrorCode status;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  iVar1 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                    ((double)((int)(((double)delta + -0.5) * 29.530588853) + newMoon),this,1);
  if (0x1d < dom) {
    Calendar::set(&this->super_Calendar,UCAL_JULIAN_DAY,dom + iVar1 + 0x253d8a);
    Calendar::complete(&this->super_Calendar,(UErrorCode *)((long)&uStack_28 + 4));
    if (0 < uStack_28._4_4_) {
      return;
    }
    iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x16])(this,5,(long)&uStack_28 + 4)
    ;
    if (iVar2 < dom) {
      return;
    }
    if (0 < uStack_28._4_4_) {
      return;
    }
  }
  Calendar::set(&this->super_Calendar,UCAL_JULIAN_DAY,dom + iVar1 + 0x253d8b);
  return;
}

Assistant:

void ChineseCalendar::offsetMonth(int32_t newMoon, int32_t dom, int32_t delta) {
    UErrorCode status = U_ZERO_ERROR;

    // Move to the middle of the month before our target month.
    newMoon += (int32_t) (CalendarAstronomer::SYNODIC_MONTH * (delta - 0.5));

    // Search forward to the target month's new moon
    newMoon = newMoonNear(newMoon, TRUE);

    // Find the target dom
    int32_t jd = newMoon + kEpochStartAsJulianDay - 1 + dom;

    // Pin the dom.  In this calendar all months are 29 or 30 days
    // so pinning just means handling dom 30.
    if (dom > 29) {
        set(UCAL_JULIAN_DAY, jd-1);
        // TODO Fix this.  We really shouldn't ever have to
        // explicitly call complete().  This is either a bug in
        // this method, in ChineseCalendar, or in
        // Calendar.getActualMaximum().  I suspect the last.
        complete(status);
        if (U_FAILURE(status)) return;
        if (getActualMaximum(UCAL_DAY_OF_MONTH, status) >= dom) {
            if (U_FAILURE(status)) return;
            set(UCAL_JULIAN_DAY, jd);
        }
    } else {
        set(UCAL_JULIAN_DAY, jd);
    }
}